

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUIEnvironment::removeFocus(CGUIEnvironment *this,IGUIElement *element)

{
  ulong uVar1;
  _func_int **in_RSI;
  IReferenceCounted *in_RDI;
  SEvent e;
  undefined4 local_50 [2];
  _func_int **local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  if ((in_RDI[0x12]._vptr_IReferenceCounted != (_func_int **)0x0) &&
     (in_RDI[0x12]._vptr_IReferenceCounted == in_RSI)) {
    local_50[0] = 0;
    local_48 = in_RDI[0x12]._vptr_IReferenceCounted;
    local_40 = 0;
    local_38 = 0;
    uVar1 = (**(code **)(*in_RDI[0x12]._vptr_IReferenceCounted + 0x10))
                      (in_RDI[0x12]._vptr_IReferenceCounted,local_50);
    if ((uVar1 & 1) != 0) {
      return false;
    }
  }
  if (in_RDI[0x12]._vptr_IReferenceCounted != (_func_int **)0x0) {
    IReferenceCounted::drop(in_RDI);
    in_RDI[0x12]._vptr_IReferenceCounted = (_func_int **)0x0;
  }
  return true;
}

Assistant:

bool CGUIEnvironment::removeFocus(IGUIElement *element)
{
	if (Focus && Focus == element) {
		SEvent e;
		e.EventType = EET_GUI_EVENT;
		e.GUIEvent.Caller = Focus;
		e.GUIEvent.Element = 0;
		e.GUIEvent.EventType = EGET_ELEMENT_FOCUS_LOST;
		if (Focus->OnEvent(e)) {
			return false;
		}
	}
	if (Focus) {
		Focus->drop();
		Focus = 0;
	}

	return true;
}